

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O0

block * gen_geneve6(compiler_state_t *cstate,int vni)

{
  block *b0_00;
  slist *psVar1;
  block *b1_00;
  slist *s1;
  slist *s;
  block *b1;
  block *b0;
  int vni_local;
  compiler_state_t *cstate_local;
  
  b0_00 = gen_geneve_check(cstate,gen_port6,OR_TRAN_IPV6,vni);
  s1 = gen_abs_offset_varpart(cstate,&cstate->off_linkpl);
  if (s1 == (slist *)0x0) {
    s1 = new_stmt(cstate,0);
    (s1->s).k = 0x28;
  }
  else {
    psVar1 = new_stmt(cstate,0);
    (psVar1->s).k = 0x28;
    sappend(s1,psVar1);
    psVar1 = new_stmt(cstate,0xc);
    (psVar1->s).k = 0;
    sappend(s1,psVar1);
  }
  psVar1 = new_stmt(cstate,7);
  sappend(s1,psVar1);
  b1_00 = new_block(cstate,0x1d);
  b1_00->stmts = s1;
  (b1_00->s).k = 0;
  gen_and(b0_00,b1_00);
  return b1_00;
}

Assistant:

static struct block *
gen_geneve6(compiler_state_t *cstate, int vni)
{
	struct block *b0, *b1;
	struct slist *s, *s1;

	b0 = gen_geneve_check(cstate, gen_port6, OR_TRAN_IPV6, vni);

	/* Load the IP header length. We need to account for a
	 * variable length link prefix if there is one. */
	s = gen_abs_offset_varpart(cstate, &cstate->off_linkpl);
	if (s) {
		s1 = new_stmt(cstate, BPF_LD|BPF_IMM);
		s1->s.k = 40;
		sappend(s, s1);

		s1 = new_stmt(cstate, BPF_ALU|BPF_ADD|BPF_X);
		s1->s.k = 0;
		sappend(s, s1);
	} else {
		s = new_stmt(cstate, BPF_LD|BPF_IMM);
		s->s.k = 40;
	}

	/* Forcibly append these statements to the true condition
	 * of the protocol check by creating a new block that is
	 * always true and ANDing them. */
	s1 = new_stmt(cstate, BPF_MISC|BPF_TAX);
	sappend(s, s1);

	b1 = new_block(cstate, BPF_JMP|BPF_JEQ|BPF_X);
	b1->stmts = s;
	b1->s.k = 0;

	gen_and(b0, b1);

	return b1;
}